

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TArray<FString,_FString>::DoCopy(TArray<FString,_FString> *this,TArray<FString,_FString> *other)

{
  uint uVar1;
  FString *pFVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = other->Count;
  this->Count = uVar1;
  this->Most = uVar1;
  if ((ulong)uVar1 == 0) {
    this->Array = (FString *)0x0;
  }
  else {
    pFVar2 = (FString *)
             M_Malloc_Dbg((ulong)uVar1 << 3,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                          ,0x19e);
    this->Array = pFVar2;
    if (this->Count != 0) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        FString::AttachToOther
                  ((FString *)((long)&this->Array->Chars + lVar4),
                   (FString *)((long)&other->Array->Chars + lVar4));
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 8;
      } while (uVar3 < this->Count);
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}